

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O1

size_t lj_gc_separateudata(global_State *g,int all)

{
  GCobj *root;
  cTValue *pcVar1;
  uint *puVar2;
  uint uVar3;
  GCtab *mt;
  uint *puVar4;
  uint *puVar5;
  size_t sVar6;
  
  puVar4 = (uint *)(ulong)(g->mainthref).gcptr32;
  uVar3 = *puVar4;
  if (uVar3 == 0) {
    sVar6 = 0;
  }
  else {
    sVar6 = 0;
    do {
      puVar5 = (uint *)(ulong)uVar3;
      if (((puVar5[1] & 8) == 0) && ((puVar5[1] & 3) != 0 || all != 0)) {
        mt = (GCtab *)(ulong)puVar5[4];
        if ((mt == (GCtab *)0x0) ||
           (((mt->nomm & 4) != 0 ||
            (pcVar1 = lj_meta_cache(mt,MM_gc,(GCstr *)(ulong)g->gcroot[2].gcptr32),
            pcVar1 == (cTValue *)0x0)))) {
          *(byte *)(puVar5 + 1) = (byte)puVar5[1] | 8;
        }
        else {
          *(byte *)(puVar5 + 1) = (byte)puVar5[1] | 8;
          sVar6 = sVar6 + puVar5[3] + 0x18;
          *puVar4 = *puVar5;
          puVar2 = (uint *)(ulong)(g->gc).mmudata.gcptr32;
          if (puVar2 == (uint *)0x0) {
            *puVar5 = uVar3;
          }
          else {
            *puVar5 = *puVar2;
            *puVar2 = uVar3;
          }
          (g->gc).mmudata.gcptr32 = uVar3;
          puVar5 = puVar4;
        }
      }
      uVar3 = *puVar5;
      puVar4 = puVar5;
    } while (uVar3 != 0);
  }
  return sVar6;
}

Assistant:

size_t lj_gc_separateudata(global_State *g, int all)
{
  size_t m = 0;
  GCRef *p = &mainthread(g)->nextgc;
  GCobj *o;
  while ((o = gcref(*p)) != NULL) {
    if (!(iswhite(o) || all) || isfinalized(gco2ud(o))) {
      p = &o->gch.nextgc;  /* Nothing to do. */
    } else if (!lj_meta_fastg(g, tabref(gco2ud(o)->metatable), MM_gc)) {
      markfinalized(o);  /* Done, as there's no __gc metamethod. */
      p = &o->gch.nextgc;
    } else {  /* Otherwise move userdata to be finalized to mmudata list. */
      m += sizeudata(gco2ud(o));
      markfinalized(o);
      *p = o->gch.nextgc;
      if (gcref(g->gc.mmudata)) {  /* Link to end of mmudata list. */
	GCobj *root = gcref(g->gc.mmudata);
	setgcrefr(o->gch.nextgc, root->gch.nextgc);
	setgcref(root->gch.nextgc, o);
	setgcref(g->gc.mmudata, o);
      } else {  /* Create circular list. */
	setgcref(o->gch.nextgc, o);
	setgcref(g->gc.mmudata, o);
      }
    }
  }
  return m;
}